

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::ftranFT(HFactor *this,HVector *vector)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  HighsInt k;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  int local_3c;
  
  local_3c = vector->count;
  piVar3 = (vector->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar5;
  uVar12 = uVar10 >> 2;
  piVar6 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = 0;
  iVar11 = (int)uVar12;
  uVar16 = 0;
  if (0 < iVar11) {
    uVar16 = uVar12 & 0xffffffff;
  }
  while (uVar15 != uVar16) {
    iVar2 = piVar5[uVar15];
    dVar17 = pdVar4[iVar2];
    piVar1 = piVar6 + uVar15;
    lVar13 = uVar15 + 1;
    uVar15 = uVar15 + 1;
    dVar18 = dVar17;
    for (lVar14 = (long)*piVar1; lVar14 < piVar6[lVar13]; lVar14 = lVar14 + 1) {
      dVar18 = dVar18 - pdVar4[piVar7[lVar14]] * pdVar8[lVar14];
    }
    if ((((dVar17 != 0.0) || (NAN(dVar17))) || (dVar18 != 0.0)) || (NAN(dVar18))) {
      if ((dVar17 == 0.0) && (!NAN(dVar17))) {
        lVar13 = (long)local_3c;
        local_3c = local_3c + 1;
        piVar3[lVar13] = iVar2;
      }
      pdVar4[iVar2] =
           (double)(~-(ulong)(ABS(dVar18) < 1e-14) & (ulong)dVar18 |
                   -(ulong)(ABS(dVar18) < 1e-14) & 0x358dee7a4ad4b81f);
    }
  }
  vector->count = local_3c;
  iVar2 = *(int *)((long)piVar6 + ((long)(uVar10 * 0x40000000) >> 0x1e));
  iVar9 = iVar2 * 5;
  dVar17 = (double)(iVar11 * 0x14 + iVar9) + vector->synthetic_tick;
  if (iVar2 / (iVar11 + 1) < 5) {
    dVar17 = dVar17 + (double)iVar9;
  }
  vector->synthetic_tick = dVar17;
  return;
}

Assistant:

void HFactor::ftranFT(HVector& vector) const {
  // Alias to non constant
  assert(vector.count >= 0);
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();
  // Alias to PF buffer
  const HighsInt pf_pivot_count = pf_pivot_index.size();
  const HighsInt* pf_pivot_index = this->pf_pivot_index.data();
  const HighsInt* pf_start = this->pf_start.data();
  const HighsInt* pf_index = this->pf_index.data();
  const double* pf_value = this->pf_value.data();
  for (HighsInt i = 0; i < pf_pivot_count; i++) {
    HighsInt iRow = pf_pivot_index[i];
    double value0 = rhs_array[iRow];
    double value1 = value0;
    const HighsInt start = pf_start[i];
    const HighsInt end = pf_start[i + 1];
    for (HighsInt k = start; k < end; k++)
      value1 -= rhs_array[pf_index[k]] * pf_value[k];
    // This would skip the situation where they are both zeros
    if (value0 || value1) {
      if (value0 == 0) rhs_index[rhs_count++] = iRow;
      rhs_array[iRow] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
  // Save count back
  vector.count = rhs_count;
  vector.synthetic_tick += pf_pivot_count * 20 + pf_start[pf_pivot_count] * 5;
  if (pf_start[pf_pivot_count] / (pf_pivot_count + 1) < 5) {
    vector.synthetic_tick += pf_start[pf_pivot_count] * 5;
  }
}